

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_decoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalValenceDecoder::NewActiveCornerReached
          (MeshEdgebreakerTraversalValenceDecoder *this,CornerIndex corner)

{
  reference pvVar1;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *index;
  long in_RDI;
  int clamped_valence;
  int active_valence;
  CornerIndex prev;
  CornerIndex next;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *in_stack_ffffffffffffff08;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
  *in_stack_ffffffffffffff10;
  CornerTable *in_stack_ffffffffffffff18;
  CornerIndex in_stack_ffffffffffffff20;
  int local_88;
  
  CornerTable::Next(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  CornerTable::Previous(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  switch(*(undefined4 *)(in_RDI + 0x100)) {
  case 0:
  case 1:
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 1;
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 1;
    break;
  default:
    break;
  case 3:
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 1;
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 2;
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 1;
    break;
  case 5:
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 1;
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 1;
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 2;
    break;
  case 7:
    in_stack_ffffffffffffff10 =
         (IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int> *)
         (in_RDI + 0xe8);
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 2;
    in_stack_ffffffffffffff18 = (CornerTable *)(in_RDI + 0xe8);
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 2;
    in_stack_ffffffffffffff20.value_ = (int)in_RDI + 0xe8;
    CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pvVar1 = *pvVar1 + 2;
  }
  index = (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)(in_RDI + 0xe8);
  CornerTable::Vertex(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  pvVar1 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
           operator[](in_stack_ffffffffffffff10,index);
  local_88 = *pvVar1;
  if (local_88 < *(int *)(in_RDI + 0x108)) {
    local_88 = *(int *)(in_RDI + 0x108);
  }
  else if (*(int *)(in_RDI + 0x10c) < local_88) {
    local_88 = *(int *)(in_RDI + 0x10c);
  }
  *(int *)(in_RDI + 0x104) = local_88 - *(int *)(in_RDI + 0x108);
  return;
}

Assistant:

inline void NewActiveCornerReached(CornerIndex corner) {
    const CornerIndex next = corner_table_->Next(corner);
    const CornerIndex prev = corner_table_->Previous(corner);
    // Update valences.
    switch (last_symbol_) {
      case TOPOLOGY_C:
      case TOPOLOGY_S:
        vertex_valences_[corner_table_->Vertex(next)] += 1;
        vertex_valences_[corner_table_->Vertex(prev)] += 1;
        break;
      case TOPOLOGY_R:
        vertex_valences_[corner_table_->Vertex(corner)] += 1;
        vertex_valences_[corner_table_->Vertex(next)] += 1;
        vertex_valences_[corner_table_->Vertex(prev)] += 2;
        break;
      case TOPOLOGY_L:
        vertex_valences_[corner_table_->Vertex(corner)] += 1;
        vertex_valences_[corner_table_->Vertex(next)] += 2;
        vertex_valences_[corner_table_->Vertex(prev)] += 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_table_->Vertex(corner)] += 2;
        vertex_valences_[corner_table_->Vertex(next)] += 2;
        vertex_valences_[corner_table_->Vertex(prev)] += 2;
        break;
      default:
        break;
    }
    // Compute the new context that is going to be used to decode the next
    // symbol.
    const int active_valence = vertex_valences_[corner_table_->Vertex(next)];
    int clamped_valence;
    if (active_valence < min_valence_) {
      clamped_valence = min_valence_;
    } else if (active_valence > max_valence_) {
      clamped_valence = max_valence_;
    } else {
      clamped_valence = active_valence;
    }

    active_context_ = (clamped_valence - min_valence_);
  }